

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O0

BOOL __thiscall LASquadtree::manage_cell(LASquadtree *this,U32 cell_index,BOOL finalize)

{
  uint uVar1;
  U32 UVar2;
  U32 *pUVar3;
  uint uVar4;
  uint local_34;
  U32 local_30;
  U32 level_index;
  U32 level;
  U32 index;
  U32 i_1;
  U32 i;
  U32 adaptive_bit;
  U32 adaptive_pos;
  BOOL finalize_local;
  U32 cell_index_local;
  LASquadtree *this_local;
  
  uVar1 = cell_index >> 5;
  if (this->adaptive_alloc <= uVar1) {
    if (this->adaptive == (U32 *)0x0) {
      pUVar3 = (U32 *)malloc((ulong)(uVar1 + 1) << 2);
      this->adaptive = pUVar3;
      for (level = this->adaptive_alloc; level <= uVar1; level = level + 1) {
        this->adaptive[level] = 0;
      }
      this->adaptive_alloc = uVar1 + 1;
    }
    else {
      pUVar3 = (U32 *)realloc_las(this->adaptive,(ulong)(uVar1 << 1) << 2);
      this->adaptive = pUVar3;
      for (index = this->adaptive_alloc; index < uVar1 << 1; index = index + 1) {
        this->adaptive[index] = 0;
      }
      this->adaptive_alloc = uVar1 << 1;
    }
  }
  this->adaptive[uVar1] = (1 << ((byte)cell_index & 0x1f) ^ 0xffffffffU) & this->adaptive[uVar1];
  local_30 = get_level(this,cell_index);
  local_34 = get_level_index(this,cell_index,local_30);
  while( true ) {
    if (local_30 == 0) {
      return true;
    }
    local_30 = local_30 - 1;
    local_34 = local_34 >> 2;
    UVar2 = get_cell_index(this,local_34,local_30);
    uVar1 = UVar2 >> 5;
    uVar4 = 1 << ((byte)UVar2 & 0x1f);
    if ((this->adaptive[uVar1] & uVar4) != 0) break;
    this->adaptive[uVar1] = uVar4 | this->adaptive[uVar1];
  }
  return true;
}

Assistant:

BOOL LASquadtree::manage_cell(const U32 cell_index, const BOOL finalize)
{
  U32 adaptive_pos = cell_index/32;
  U32 adaptive_bit = ((U32)1) << (cell_index%32);
  if (adaptive_pos >= adaptive_alloc)
  {
    if (adaptive)
    {
      adaptive = (U32*)realloc_las(adaptive, adaptive_pos*2*sizeof(U32));
      for (U32 i = adaptive_alloc; i < adaptive_pos*2; i++) adaptive[i] = 0;
      adaptive_alloc = adaptive_pos*2;
    }
    else
    {
#pragma warning(push)
#pragma warning(disable : 6011)
      adaptive = (U32*)malloc((adaptive_pos+1)*sizeof(U32));
      for (U32 i = adaptive_alloc; i <= adaptive_pos; i++) adaptive[i] = 0;
      adaptive_alloc = adaptive_pos+1;
#pragma warning(pop)
    }
  }
  adaptive[adaptive_pos] &= ~adaptive_bit;
  U32 index;
  U32 level = get_level(cell_index);
  U32 level_index = get_level_index(cell_index, level);
  while (level)
  {
    level--;
    level_index = level_index >> 2;
    index = get_cell_index(level_index, level);
    adaptive_pos = index/32;
    adaptive_bit = ((U32)1) << (index%32);
    if (adaptive[adaptive_pos] & adaptive_bit) break;
    adaptive[adaptive_pos] |= adaptive_bit;
  }
  return TRUE;
}